

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetSelectLinker::cmTargetSelectLinker(cmTargetSelectLinker *this,cmTarget *target)

{
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar1;
  allocator_type local_13;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  this->Preference = 0;
  this->Target = target;
  cmsys::
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hashtable(&(this->Preferred)._M_ht,100,&local_11,&local_12,&local_13);
  this_00 = this->Target->Makefile;
  this->Makefile = this_00;
  pcVar1 = cmMakefile::GetGlobalGenerator(this_00);
  this->GG = pcVar1;
  return;
}

Assistant:

cmTargetSelectLinker(cmTarget const* target): Preference(0), Target(target)
    {
    this->Makefile = this->Target->GetMakefile();
    this->GG = this->Makefile->GetGlobalGenerator();
    }